

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
::resize(raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
         *this,size_t new_capacity)

{
  size_t hashval;
  ctrl_t *p;
  slot_type *pptVar1;
  size_t capacity;
  undefined1 auVar2 [16];
  size_t i;
  size_t sVar3;
  FindInfo FVar4;
  Layout LVar5;
  
  if ((new_capacity == 0) || ((new_capacity + 1 & new_capacity) != 0)) {
    __assert_fail("IsValidCapacity(new_capacity)",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x807,
                  "void phmap::priv::raw_hash_set<phmap::priv::NodeHashMapPolicy<int, int>, phmap::priv::StatefulTestingHash, phmap::priv::StatefulTestingEqual, phmap::priv::Alloc<std::pair<const int, int>>>::resize(size_t) [Policy = phmap::priv::NodeHashMapPolicy<int, int>, Hash = phmap::priv::StatefulTestingHash, Eq = phmap::priv::StatefulTestingEqual, Alloc = phmap::priv::Alloc<std::pair<const int, int>>]"
                 );
  }
  p = this->ctrl_;
  pptVar1 = this->slots_;
  capacity = this->capacity_;
  initialize_slots(this,new_capacity);
  this->capacity_ = new_capacity;
  for (sVar3 = 0; capacity != sVar3; sVar3 = sVar3 + 1) {
    if (-1 < p[sVar3]) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)pptVar1[sVar3]->first;
      hashval = SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),8) +
                SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),0);
      FVar4 = find_first_non_full(this,hashval);
      set_ctrl(this,FVar4.offset,(byte)hashval & 0x7f);
      this->slots_[FVar4.offset] = pptVar1[sVar3];
    }
  }
  if (capacity != 0) {
    LVar5 = MakeLayout(capacity);
    Deallocate<8ul,phmap::priv::Alloc<std::pair<int_const,int>>>
              ((Alloc<std::pair<const_int,_int>_> *)&this->settings_,p,
               (LVar5.super_LayoutType<sizeof___(Ts),_signed_char,_std::pair<const_int,_int>_*>.
                size_[0] + 7 & 0xfffffffffffffff8) +
               LVar5.super_LayoutType<sizeof___(Ts),_signed_char,_std::pair<const_int,_int>_*>.size_
               [1] * 8);
    return;
  }
  return;
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }